

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O1

void nk_glfw3_device_destroy(nk_glfw *glfw)

{
  void *pvVar1;
  nk_plugin_free UNRECOVERED_JUMPTABLE;
  
  (*glad_glDetachShader)((glfw->ogl).prog,(glfw->ogl).vert_shdr);
  (*glad_glDetachShader)((glfw->ogl).prog,(glfw->ogl).frag_shdr);
  (*glad_glDeleteShader)((glfw->ogl).vert_shdr);
  (*glad_glDeleteShader)((glfw->ogl).frag_shdr);
  (*glad_glDeleteProgram)((glfw->ogl).prog);
  (*glad_glDeleteTextures)(1,&(glfw->ogl).font_tex);
  (*glad_glDeleteBuffers)(1,&(glfw->ogl).vbo);
  (*glad_glDeleteBuffers)(1,&(glfw->ogl).ebo);
  pvVar1 = (glfw->ogl).cmds.memory.ptr;
  if (((pvVar1 != (void *)0x0) && ((glfw->ogl).cmds.type != NK_BUFFER_FIXED)) &&
     (UNRECOVERED_JUMPTABLE = (glfw->ogl).cmds.pool.free,
     UNRECOVERED_JUMPTABLE != (nk_plugin_free)0x0)) {
    (*UNRECOVERED_JUMPTABLE)((glfw->ogl).cmds.pool.userdata,pvVar1);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_glfw3_device_destroy(struct nk_glfw* glfw)
{
    struct nk_glfw_device *dev = &glfw->ogl;
    glDetachShader(dev->prog, dev->vert_shdr);
    glDetachShader(dev->prog, dev->frag_shdr);
    glDeleteShader(dev->vert_shdr);
    glDeleteShader(dev->frag_shdr);
    glDeleteProgram(dev->prog);
    glDeleteTextures(1, &dev->font_tex);
    glDeleteBuffers(1, &dev->vbo);
    glDeleteBuffers(1, &dev->ebo);
    nk_buffer_free(&dev->cmds);
}